

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O0

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  pointer *this_00;
  float fVar1;
  float fVar2;
  AABox *a;
  treenode *ptVar3;
  size_type sVar4;
  reference ppBVar5;
  ulong uVar6;
  iterator __first;
  iterator __last;
  reference pvVar7;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  allocator<BasicPrimitive_*> local_211;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_210;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_208;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_200;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_1f8;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_1f0;
  allocator<BasicPrimitive_*> local_1d1;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_1d0;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_1c8;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_1c0;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  local_1b8;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_1b0;
  int local_198;
  int local_194;
  int i_3;
  int best;
  int rangemax;
  int rangemin;
  undefined1 local_170 [24];
  int local_158;
  undefined1 auStack_154 [4];
  int i_2;
  float local_14c;
  float fStack_148;
  float local_144;
  float fStack_140;
  AABox local_13c;
  undefined1 local_124 [24];
  int local_10c;
  undefined1 auStack_108 [4];
  int i_1;
  AABox accu;
  vector<float,_std::allocator<float>_> suffix_area;
  vector<float,_std::allocator<float>_> prefix_area;
  _lambda_BasicPrimitive__BasicPrimitive___3_ local_ab;
  _lambda_BasicPrimitive__BasicPrimitive___2_ local_aa;
  _lambda_BasicPrimitive__BasicPrimitive___1_ local_a9;
  _func_bool_BasicPrimitive_ptr_BasicPrimitive_ptr *local_a8;
  _func_bool_BasicPrimitive_ptr_BasicPrimitive_ptr *cmp;
  AABox local_84;
  int local_6c;
  undefined4 uStack_68;
  int i;
  undefined8 local_60;
  undefined8 local_58;
  AABox *local_50;
  AABox *bound;
  undefined4 uStack_40;
  undefined8 local_3c;
  undefined8 local_34;
  treenode **local_20;
  treenode **cur_local;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list_local;
  BasicContainer *this_local;
  
  local_20 = cur;
  cur_local = (treenode **)list;
  list_local = (vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *)this;
  if (*cur == (treenode *)0x0) {
    ptVar3 = (treenode *)operator_new(0x30);
    (ptVar3->bound).y1 = 0.0;
    (ptVar3->bound).y2 = 0.0;
    (ptVar3->bound).z1 = 0.0;
    (ptVar3->bound).z2 = 0.0;
    ptVar3->shape = (BasicPrimitive *)0x0;
    (ptVar3->bound).x1 = 0.0;
    (ptVar3->bound).x2 = 0.0;
    ptVar3->lc = (treenode *)0x0;
    ptVar3->rc = (treenode *)0x0;
    treenode::treenode(ptVar3);
    *local_20 = ptVar3;
  }
  sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
  if (sVar4 == 1) {
    ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[](list,0);
    (*local_20)->shape = *ppBVar5;
    ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[](list,0);
    (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])((long)&bound + 4);
    ptVar3 = *local_20;
    (ptVar3->bound).x1 = (float)bound._4_4_;
    (ptVar3->bound).x2 = (float)uStack_40;
    (ptVar3->bound).y1 = (float)(undefined4)local_3c;
    (ptVar3->bound).y2 = (float)local_3c._4_4_;
    (ptVar3->bound).z1 = (float)(undefined4)local_34;
    (ptVar3->bound).z2 = (float)local_34._4_4_;
  }
  else {
    local_50 = &(*local_20)->bound;
    ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[](list,0);
    (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])(&stack0xffffffffffffff98);
    local_50->x1 = (float)uStack_68;
    local_50->x2 = (float)i;
    local_50->y1 = (float)(undefined4)local_60;
    local_50->y2 = (float)local_60._4_4_;
    local_50->z1 = (float)(undefined4)local_58;
    local_50->z2 = (float)local_58._4_4_;
    local_6c = 1;
    while( true ) {
      uVar6 = (ulong)local_6c;
      sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
      a = local_50;
      if (sVar4 <= uVar6) break;
      ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                          (list,(long)local_6c);
      (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])((long)&cmp + 4);
      ::operator+(&local_84,a,(AABox *)((long)&cmp + 4));
      local_50->x1 = local_84.x1;
      local_50->x2 = local_84.x2;
      local_50->y1 = local_84.y1;
      local_50->y2 = local_84.y2;
      local_50->z1 = local_84.z1;
      local_50->z2 = local_84.z2;
      local_6c = local_6c + 1;
    }
    local_a8 = build(std::vector,BasicContainer::treenode*&)::
               {lambda(BasicPrimitive*,BasicPrimitive*)#1}::operator_cast_to_function_pointer
                         (&local_a9);
    if (local_50->x2 - local_50->x1 < local_50->y2 - local_50->y1) {
      local_a8 = build(std::vector,BasicContainer::treenode*&)::
                 {lambda(BasicPrimitive*,BasicPrimitive*)#2}::operator_cast_to_function_pointer
                           (&local_aa);
    }
    if ((local_50->x2 - local_50->x1 < local_50->z2 - local_50->z1) &&
       (local_50->y2 - local_50->y1 < local_50->z2 - local_50->z1)) {
      local_a8 = build(std::vector,BasicContainer::treenode*&)::
                 {lambda(BasicPrimitive*,BasicPrimitive*)#3}::operator_cast_to_function_pointer
                           (&local_ab);
    }
    __first = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin(list);
    __last = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::end(list);
    std::
    sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,bool(*)(BasicPrimitive*,BasicPrimitive*)>
              ((__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )__first._M_current,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )__last._M_current,local_a8);
    this_00 = &suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)this_00);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&accu.z1);
    sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)this_00,sVar4);
    sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)&accu.z1,sVar4);
    ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[](list,0);
    (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])(auStack_108);
    local_10c = 0;
    while( true ) {
      uVar6 = (ulong)local_10c;
      sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
      if (sVar4 <= uVar6) break;
      ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                          (list,(long)local_10c);
      (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])(&local_13c);
      ::operator+((AABox *)local_124,(AABox *)auStack_108,&local_13c);
      accu.y1 = (float)local_124._16_4_;
      accu.y2 = (float)local_124._20_4_;
      auStack_108 = (undefined1  [4])local_124._0_4_;
      i_1 = local_124._4_4_;
      accu.x1 = (float)local_124._8_4_;
      accu.x2 = (float)local_124._12_4_;
      fVar8 = AABox::surfaceArea((AABox *)auStack_108);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_10c);
      *pvVar7 = fVar8;
      local_10c = local_10c + 1;
    }
    sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
    ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                        (list,sVar4 - 1);
    (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])(auStack_154);
    auStack_108 = auStack_154;
    i_1 = i_2;
    accu.x1 = local_14c;
    accu.x2 = fStack_148;
    accu.y1 = local_144;
    accu.y2 = fStack_140;
    sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
    local_158 = (int)sVar4;
    while (local_158 = local_158 + -1, -1 < local_158) {
      ppBVar5 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::operator[]
                          (list,(long)local_158);
      (*((*ppBVar5)->super_Primitive)._vptr_Primitive[1])(&rangemax);
      ::operator+((AABox *)local_170,(AABox *)auStack_108,(AABox *)&rangemax);
      accu.y1 = (float)local_170._16_4_;
      accu.y2 = (float)local_170._20_4_;
      auStack_108 = (undefined1  [4])local_170._0_4_;
      i_1 = local_170._4_4_;
      accu.x1 = (float)local_170._8_4_;
      accu.x2 = (float)local_170._12_4_;
      fVar8 = AABox::surfaceArea((AABox *)auStack_108);
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&accu.z1,(long)local_158);
      *pvVar7 = fVar8;
    }
    sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
    auVar10._8_4_ = (int)(sVar4 >> 0x20);
    auVar10._0_8_ = sVar4;
    auVar10._12_4_ = 0x45300000;
    dVar9 = round(((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.15);
    best = (int)dVar9;
    sVar4 = std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::size(list);
    auVar11._8_4_ = (int)(sVar4 >> 0x20);
    auVar11._0_8_ = sVar4;
    auVar11._12_4_ = 0x45300000;
    dVar9 = round(((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 0.85);
    i_3 = (int)(dVar9 - 1.0);
    local_194 = best;
    for (local_198 = best; local_198 < i_3; local_198 = local_198 + 1) {
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_198);
      fVar8 = *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&accu.z1,(long)(local_198 + 1));
      fVar1 = *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)
                          &suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)local_194);
      fVar2 = *pvVar7;
      pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&accu.z1,(long)(local_194 + 1));
      if (fVar8 + fVar1 < fVar2 + *pvVar7) {
        local_194 = local_198;
      }
    }
    local_1b8._M_current =
         (BasicPrimitive **)
         std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin(list);
    local_1d0._M_current =
         (BasicPrimitive **)
         std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin(list);
    local_1c8 = __gnu_cxx::
                __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                ::operator+(&local_1d0,(long)local_194);
    local_1c0 = __gnu_cxx::
                __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                ::operator+(&local_1c8,1);
    std::allocator<BasicPrimitive_*>::allocator(&local_1d1);
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_1b0,local_1b8,
               local_1c0,&local_1d1);
    build(this,&local_1b0,&(*local_20)->lc);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector(&local_1b0);
    std::allocator<BasicPrimitive_*>::~allocator(&local_1d1);
    local_208._M_current =
         (BasicPrimitive **)
         std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::begin(list);
    local_200 = __gnu_cxx::
                __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                ::operator+(&local_208,(long)local_194);
    local_1f8 = __gnu_cxx::
                __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                ::operator+(&local_200,1);
    local_210._M_current =
         (BasicPrimitive **)
         std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::end(list);
    std::allocator<BasicPrimitive_*>::allocator(&local_211);
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_1f0,local_1f8,
               local_210,&local_211);
    build(this,&local_1f0,&(*local_20)->rc);
    std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>::~vector(&local_1f0);
    std::allocator<BasicPrimitive_*>::~allocator(&local_211);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&accu.z1);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               &suffix_area.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}